

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hak.cpp
# Opt level: O0

int __thiscall libDAI::HAK::init(HAK *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  size_t sVar4;
  reference p;
  undefined1 auVar5 [16];
  undefined1 in_ZMM0 [64];
  size_t ab;
  iterator beta;
  iterator alpha;
  vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
  *in_stack_ffffffffffffff48;
  reference in_stack_ffffffffffffff50;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff88;
  ulong uVar6;
  ulong __n;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_60;
  TFactor<double> *local_58;
  TFactor<double> *local_50;
  __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
  local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffffc4;
  size_t in_stack_ffffffffffffffc8;
  Exception *in_stack_ffffffffffffffd0;
  
  uVar2 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[0x11])();
  if ((uVar2 & 1) == 0) {
    uVar7 = CONCAT13(1,(int3)in_stack_ffffffffffffffc0);
    uVar3 = __cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(allocator<char> *)this);
    Exception::Exception
              (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,
               (string *)CONCAT44(in_stack_ffffffffffffffc4,uVar7));
    __cxa_throw(uVar3,&Exception::typeinfo,Exception::~Exception);
  }
  local_48._M_current =
       (TFactor<double> *)
       std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                 (in_stack_ffffffffffffff48);
  while( true ) {
    local_50 = (TFactor<double> *)
               std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
                         (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff48);
    auVar5 = in_ZMM0._0_16_;
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_48);
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_48);
    sVar4 = TFactor<double>::stateSpace((TFactor<double> *)0xb49081);
    auVar5 = vcvtusi2sd_avx512f(auVar5,sVar4);
    in_ZMM0 = ZEXT864((ulong)(1.0 / auVar5._0_8_));
    TFactor<double>::fill(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
    local_58 = (TFactor<double> *)
               __gnu_cxx::
               __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
               ::operator++(in_stack_ffffffffffffff58,
                            (int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  }
  local_60._M_current =
       (TFactor<double> *)
       std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::begin
                 (in_stack_ffffffffffffff48);
  while( true ) {
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::end
              (in_stack_ffffffffffffff48);
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff50,
                       (__normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
                        *)in_stack_ffffffffffffff48);
    auVar5 = in_ZMM0._0_16_;
    if (!bVar1) break;
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_60);
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator->(&local_60);
    sVar4 = TFactor<double>::stateSpace((TFactor<double> *)0xb49112);
    auVar5 = vcvtusi2sd_avx512f(auVar5,sVar4);
    in_ZMM0 = ZEXT864((ulong)(1.0 / auVar5._0_8_));
    TFactor<double>::fill(in_stack_ffffffffffffff50,(double)in_stack_ffffffffffffff48);
    __gnu_cxx::
    __normal_iterator<libDAI::TFactor<double>_*,_std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>_>
    ::operator++(in_stack_ffffffffffffff58,(int)((ulong)in_stack_ffffffffffffff50 >> 0x20));
  }
  uVar6 = 0;
  while( true ) {
    auVar5 = in_ZMM0._0_16_;
    __n = uVar6;
    (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
    sVar4 = RegionGraph::nr_Redges((RegionGraph *)0xb49167);
    if (sVar4 <= uVar6) break;
    p = std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                  (&this->_muab,__n);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              (&this->_muab,__n);
    sVar4 = TFactor<double>::stateSpace((TFactor<double> *)0xb491b0);
    auVar5 = vcvtusi2sd_avx512f(auVar5,sVar4);
    auVar5._0_8_ = 1.0 / auVar5._0_8_;
    auVar5._8_8_ = 0;
    TFactor<double>::fill(in_stack_ffffffffffffff50,(double)p);
    in_stack_ffffffffffffff50 =
         std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
                   (&this->_muba,__n);
    std::vector<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>::operator[]
              (&this->_muba,__n);
    sVar4 = TFactor<double>::stateSpace((TFactor<double> *)0xb49204);
    auVar5 = vcvtusi2sd_avx512f(auVar5,sVar4);
    in_ZMM0 = ZEXT864((ulong)(1.0 / auVar5._0_8_));
    TFactor<double>::fill(in_stack_ffffffffffffff50,(double)p);
    uVar6 = __n + 1;
  }
  return (int)uVar6;
}

Assistant:

void HAK::init() {
        if( !initProps() )
            DAI_THROW(NOT_ALL_PROPERTIES_SPECIFIED);

        for( vector<Factor>::iterator alpha = _Qa.begin(); alpha != _Qa.end(); alpha++ )
            alpha->fill( 1.0 / alpha->stateSpace() );

        for( vector<Factor>::iterator beta = _Qb.begin(); beta != _Qb.end(); beta++ )
            beta->fill( 1.0 / beta->stateSpace() );

        for( size_t ab = 0; ab < grm().nr_Redges(); ab++ ) {
            _muab[ab].fill( 1.0 / _muab[ab].stateSpace() );
            _muba[ab].fill( 1.0 / _muba[ab].stateSpace() );
        }
    }